

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do_wear.c
# Opt level: O0

int dotakeoff(obj *otmp)

{
  bool bVar1;
  boolean bVar2;
  char *pcVar3;
  obj *local_18;
  obj *otmp_local;
  
  if ((otmp != (obj *)0x0) && (bVar2 = validate_object(otmp,"\x03","take off"), bVar2 == '\0')) {
    return 0;
  }
  local_18 = otmp;
  if (otmp == (obj *)0x0) {
    local_18 = getobj("\x03\x04\x05\x06\a","take off",(obj **)0x0);
  }
  if (local_18 == (obj *)0x0) {
    otmp_local._4_4_ = 0;
  }
  else if (local_18->oclass == '\x03') {
    if ((local_18->owornmask & 0x7fU) == 0) {
      pline("You are not wearing that.");
      otmp_local._4_4_ = 0;
    }
    else if (local_18 == uskin) {
      bVar1 = false;
      if (0x5e < uskin->otyp) {
        bVar1 = uskin->otyp < 0x6a;
      }
      pcVar3 = "dragon scale mail is";
      if (bVar1) {
        pcVar3 = "dragon scales are";
      }
      pline("The %s merged with your skin!",pcVar3);
      otmp_local._4_4_ = 0;
    }
    else if (((local_18 == uarm) && (uarmc != (obj *)0x0)) ||
            ((local_18 == uarmu && ((uarmc != (obj *)0x0 || (uarm != (obj *)0x0)))))) {
      pline("The rest of your armor is in the way.");
      otmp_local._4_4_ = 0;
    }
    else {
      reset_remarm();
      select_off(local_18);
      if (takeoff_mask == 0) {
        otmp_local._4_4_ = 0;
      }
      else {
        reset_remarm();
        armoroff(local_18);
        otmp_local._4_4_ = 1;
      }
    }
  }
  else {
    otmp_local._4_4_ = doremring(local_18);
  }
  return otmp_local._4_4_;
}

Assistant:

int dotakeoff(struct obj *otmp)
{
	if (otmp && !validate_object(otmp, clothes, "take off"))
		return 0;
	else if (!otmp)
		otmp = getobj(clothes_and_accessories, "take off", NULL);
	if (!otmp) return 0;
        if (otmp->oclass != ARMOR_CLASS) return doremring(otmp);
	if (!(otmp->owornmask & W_ARMOR)) {
		pline("You are not wearing that.");
		return 0;
	}
	if (otmp == uskin) {
	        pline("The %s merged with your skin!",
		      Is_dragon_scales(uskin->otyp) ?
		      "dragon scales are" : "dragon scale mail is");
		return 0;
	}
	if (((otmp == uarm) && uarmc) ||
            ((otmp == uarmu) && (uarmc || uarm))) {
            /* TODO: replace this with a multistep remove */
	    pline("The rest of your armor is in the way.");
	    return 0;
	}

	reset_remarm();		/* clear takeoff_mask and taking_off */
	select_off(otmp);
	if (!takeoff_mask) return 0;
	reset_remarm();		/* armoroff() doesn't use takeoff_mask */

	armoroff(otmp);
	return 1;
}